

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-cast-registerer.cpp
# Opt level: O0

void __thiscall custom_matrix_registerer::test_method(custom_matrix_registerer *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  ExceptionSignal *e_11;
  string local_1748 [32];
  istringstream local_1728 [8];
  istringstream ss_11;
  ExceptionSignal *e_10;
  string local_1598 [32];
  istringstream local_1578 [8];
  istringstream ss_10;
  ExceptionSignal *e_9;
  string local_13e8 [32];
  istringstream local_13c8 [8];
  istringstream ss_9;
  ExceptionSignal *e_8;
  string local_1238 [32];
  istringstream local_1218 [8];
  istringstream ss_8;
  ExceptionSignal *e_7;
  string local_1088 [32];
  istringstream local_1068 [8];
  istringstream ss_7;
  ExceptionSignal *e_6;
  string local_ed8 [32];
  istringstream local_eb8 [8];
  istringstream ss_6;
  ExceptionSignal *e_5;
  string local_d28 [32];
  istringstream local_d08 [8];
  istringstream ss_5;
  ExceptionSignal *e_4;
  string local_b78 [32];
  istringstream local_b58 [8];
  istringstream ss_4;
  ExceptionSignal *e_3;
  string local_9c8 [32];
  istringstream local_9a8 [8];
  istringstream ss_3;
  ExceptionSignal *e_2;
  string local_818 [32];
  istringstream local_7f8 [8];
  istringstream ss_2;
  ExceptionSignal *e_1;
  string local_668 [32];
  istringstream local_648 [8];
  istringstream ss_1;
  ExceptionSignal *e;
  string local_4b8 [32];
  istringstream local_498 [8];
  istringstream ss;
  basic_cstring<const_char> local_318;
  basic_cstring<const_char> local_308;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2f8;
  basic_cstring<const_char> local_2d8;
  assertion_result local_2c8;
  basic_cstring<const_char> local_2b0;
  basic_cstring<const_char> local_2a0;
  basic_cstring<const_char> local_290;
  undefined1 local_280 [8];
  output_test_stream output;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> myMatrixSignal;
  custom_matrix_registerer *this_local;
  
  myMatrixSignal.providerMutex = (Mutex *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"matrix",&local_e9);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::Signal
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_290);
  boost::test_tools::output_test_stream::output_test_stream
            ((output_test_stream *)local_280,&local_290,1);
  dynamicgraph::operator<<((ostream *)local_280,(SignalBase<int> *)local_c8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
               ,0x71);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2a0,0xad,&local_2b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2d8,"Sig:matrix (Type Cst)");
    boost::test_tools::output_test_stream::is_equal(&local_2c8,local_280,&local_2d8,1);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_308,"output.is_equal(\"Sig:matrix (Type Cst)\")",0x28);
    boost::unit_test::operator<<(&local_2f8,prev,&local_308);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_318,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
               ,0x71);
    boost::test_tools::tt_detail::report_assertion(&local_2c8,&local_2f8,&local_318,0xad,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2f8);
    boost::test_tools::assertion_result::~assertion_result(&local_2c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::test_tools::output_test_stream::~output_test_stream((output_test_stream *)local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b8,"test",(allocator<char> *)((long)&e + 7));
  std::__cxx11::istringstream::istringstream(local_498,local_4b8,_S_in);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_498);
  std::__cxx11::istringstream::~istringstream(local_498);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_668,"[test",(allocator<char> *)((long)&e_1 + 7));
  std::__cxx11::istringstream::istringstream(local_648,local_668,_S_in);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_1 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_648);
  std::__cxx11::istringstream::~istringstream(local_648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_818,"[5[",(allocator<char> *)((long)&e_2 + 7));
  std::__cxx11::istringstream::istringstream(local_7f8,local_818,_S_in);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_2 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_7f8);
  std::__cxx11::istringstream::~istringstream(local_7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_9c8,"[5,c",(allocator<char> *)((long)&e_3 + 7));
  std::__cxx11::istringstream::istringstream(local_9a8,local_9c8,_S_in);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_3 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_9a8);
  std::__cxx11::istringstream::~istringstream(local_9a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b78,"[5,3[",(allocator<char> *)((long)&e_4 + 7));
  std::__cxx11::istringstream::istringstream(local_b58,local_b78,_S_in);
  std::__cxx11::string::~string(local_b78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_4 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_b58);
  std::__cxx11::istringstream::~istringstream(local_b58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d28,"[5,3]test",(allocator<char> *)((long)&e_5 + 7));
  std::__cxx11::istringstream::istringstream(local_d08,local_d28,_S_in);
  std::__cxx11::string::~string(local_d28);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_5 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_d08);
  std::__cxx11::istringstream::~istringstream(local_d08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ed8,"[5,3](test",(allocator<char> *)((long)&e_6 + 7));
  std::__cxx11::istringstream::istringstream(local_eb8,local_ed8,_S_in);
  std::__cxx11::string::~string(local_ed8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_6 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_eb8);
  std::__cxx11::istringstream::~istringstream(local_eb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1088,"[5,3]((1,",(allocator<char> *)((long)&e_7 + 7));
  std::__cxx11::istringstream::istringstream(local_1068,local_1088,_S_in);
  std::__cxx11::string::~string(local_1088);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_7 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_1068);
  std::__cxx11::istringstream::~istringstream(local_1068);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1238,"[5,3]((1,2,3]",(allocator<char> *)((long)&e_8 + 7));
  std::__cxx11::istringstream::istringstream(local_1218,local_1238,_S_in);
  std::__cxx11::string::~string(local_1238);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_8 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_1218);
  std::__cxx11::istringstream::~istringstream(local_1218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_13e8,"[5,1]((1)(2)(3[",(allocator<char> *)((long)&e_9 + 7));
  std::__cxx11::istringstream::istringstream(local_13c8,local_13e8,_S_in);
  std::__cxx11::string::~string(local_13e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_9 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_13c8);
  std::__cxx11::istringstream::~istringstream(local_13c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1598,"[5,1]((1)(2)(3)[",(allocator<char> *)((long)&e_10 + 7));
  std::__cxx11::istringstream::istringstream(local_1578,local_1598,_S_in);
  std::__cxx11::string::~string(local_1598);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_10 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_1578);
  std::__cxx11::istringstream::~istringstream(local_1578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1748,"[3,1]((1)(2),(3)[",(allocator<char> *)((long)&e_11 + 7));
  std::__cxx11::istringstream::istringstream(local_1728,local_1748,_S_in);
  std::__cxx11::string::~string(local_1748);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_11 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8,
             (istringstream *)local_1728);
  std::__cxx11::istringstream::~istringstream(local_1728);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_int>::~Signal
            ((Signal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_int> *)local_c8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(custom_matrix_registerer) {
  dynamicgraph::Signal<dynamicgraph::Matrix, int> myMatrixSignal("matrix");

  // Print the signal name.
  {
    output_test_stream output;
    output << myMatrixSignal;
    BOOST_CHECK(output.is_equal("Sig:matrix (Type Cst)"));
  }

  // Catch Exception of ss (not good input)

  // ss[0] != "["
  try {
    std::istringstream ss("test");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[0] != \"[\"";
  }

  // ss[1] != %i
  try {
    std::istringstream ss("[test");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[1] != %i";
  }

  // ss[2] != ","
  try {
    std::istringstream ss("[5[");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[2] != \",\"";
  }

  // ss[3] != %i
  try {
    std::istringstream ss("[5,c");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[3] != %i";
  }

  // ss[4] != "]"
  try {
    std::istringstream ss("[5,3[");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[4] != \"]\"";
  }

  // ss[5] != "("
  try {
    std::istringstream ss("[5,3]test");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[5] != \"(\"";
  }

  // ss[6] != "("
  try {
    std::istringstream ss("[5,3](test");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[6] != \"(\"";
  }

  // ss[8] != " " || ","
  try {
    std::istringstream ss("[5,3]((1,");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[8] != \" \" || \",\"";
  }

  // ss[6+n] != ")"
  try {
    std::istringstream ss("[5,3]((1,2,3]");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << ("ss[6+n] != \")\"");
  }

  // ss[-3] != ")"
  try {
    std::istringstream ss("[5,1]((1)(2)(3[");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[5] != \")\"";
  }

  // ss[-3] != ")"
  try {
    std::istringstream ss("[5,1]((1)(2)(3)[");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[5] != \")\"";
  }

  // ss[-1]!= ")"
  try {
    std::istringstream ss("[3,1]((1)(2),(3)[");
    myMatrixSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[5] != \")\" and ignore \",\"";
  }

  //[...]((...))
}